

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.cpp
# Opt level: O0

bool isItAFunction<KarpRabinHash<unsigned_long_long,unsigned_char>>(uint L)

{
  bool bVar1;
  uint32_conflict uVar2;
  reference pvVar3;
  _Map_pointer ppuVar4;
  reference puVar5;
  ostream *poVar6;
  unsigned_long_long uVar7;
  void *pvVar8;
  byte *pbVar9;
  uint local_1c84;
  undefined1 local_1c80 [4];
  uint j;
  undefined1 local_1c60 [8];
  iterator ii;
  uint local_1c38;
  char c_1;
  uchar out;
  uint32_conflict k_1;
  uchar local_1c25;
  uint local_1c24;
  undefined1 local_1c20 [3];
  uchar c;
  uint32_conflict k;
  deque<unsigned_char,_std::allocator<unsigned_char>_> s;
  KarpRabinHash<unsigned_long_long,_unsigned_char> hf;
  undefined1 local_13a8 [4];
  uint n;
  mersenneRNG generator;
  uint L_local;
  
  generator.n = L;
  mersenneRNG::mersenneRNG((mersenneRNG *)local_13a8,5);
  hf.BtoN._4_4_ = 3;
  KarpRabinHash<unsigned_long_long,_unsigned_char>::KarpRabinHash
            ((KarpRabinHash<unsigned_long_long,_unsigned_char> *)
             &s.super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Deque_impl_data._M_finish._M_node,3,generator.n);
  std::deque<unsigned_char,_std::allocator<unsigned_char>_>::deque
            ((deque<unsigned_char,_std::allocator<unsigned_char>_> *)local_1c20);
  for (local_1c24 = 0; local_1c24 < 3; local_1c24 = local_1c24 + 1) {
    uVar2 = mersenneRNG::operator()((mersenneRNG *)local_13a8);
    local_1c25 = (char)uVar2 + 'A';
    std::deque<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              ((deque<unsigned_char,_std::allocator<unsigned_char>_> *)local_1c20,&local_1c25);
    KarpRabinHash<unsigned_long_long,_unsigned_char>::eat
              ((KarpRabinHash<unsigned_long_long,_unsigned_char> *)
               &s.super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Deque_impl_data._M_finish._M_node,local_1c25);
  }
  local_1c38 = 0;
  do {
    if (99999 < local_1c38) {
      generator._5015_1_ = 1;
LAB_001043be:
      std::deque<unsigned_char,_std::allocator<unsigned_char>_>::~deque
                ((deque<unsigned_char,_std::allocator<unsigned_char>_> *)local_1c20);
      return (bool)(generator._5015_1_ & 1);
    }
    pvVar3 = std::deque<unsigned_char,_std::allocator<unsigned_char>_>::front
                       ((deque<unsigned_char,_std::allocator<unsigned_char>_> *)local_1c20);
    ii._M_node._7_1_ = *pvVar3;
    std::deque<unsigned_char,_std::allocator<unsigned_char>_>::pop_front
              ((deque<unsigned_char,_std::allocator<unsigned_char>_> *)local_1c20);
    uVar2 = mersenneRNG::operator()((mersenneRNG *)local_13a8);
    ii._M_node._5_1_ = (char)uVar2 + 'A';
    ii._M_node._6_1_ = ii._M_node._5_1_;
    std::deque<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              ((deque<unsigned_char,_std::allocator<unsigned_char>_> *)local_1c20,
               (value_type *)((long)&ii._M_node + 5));
    KarpRabinHash<unsigned_long_long,_unsigned_char>::update
              ((KarpRabinHash<unsigned_long_long,_unsigned_char> *)
               &s.super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Deque_impl_data._M_finish._M_node,ii._M_node._7_1_,ii._M_node._6_1_);
    ppuVar4 = (_Map_pointer)
              KarpRabinHash<unsigned_long_long,unsigned_char>::
              hash<std::deque<unsigned_char,std::allocator<unsigned_char>>>
                        ((KarpRabinHash<unsigned_long_long,unsigned_char> *)
                         &s.super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                          .super__Deque_impl_data._M_finish._M_node,
                         (deque<unsigned_char,_std::allocator<unsigned_char>_> *)local_1c20);
    if (ppuVar4 !=
        s.super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Deque_impl_data._M_finish._M_node) {
      std::deque<unsigned_char,_std::allocator<unsigned_char>_>::begin
                ((iterator *)local_1c60,
                 (deque<unsigned_char,_std::allocator<unsigned_char>_> *)local_1c20);
      while( true ) {
        std::deque<unsigned_char,_std::allocator<unsigned_char>_>::end
                  ((iterator *)local_1c80,
                   (deque<unsigned_char,_std::allocator<unsigned_char>_> *)local_1c20);
        bVar1 = std::operator!=((_Self *)local_1c60,(_Self *)local_1c80);
        if (!bVar1) break;
        puVar5 = std::_Deque_iterator<unsigned_char,_unsigned_char_&,_unsigned_char_*>::operator*
                           ((_Deque_iterator<unsigned_char,_unsigned_char_&,_unsigned_char_*> *)
                            local_1c60);
        poVar6 = std::operator<<((ostream *)&std::cout,*puVar5);
        poVar6 = std::operator<<(poVar6," ");
        pbVar9 = std::_Deque_iterator<unsigned_char,_unsigned_char_&,_unsigned_char_*>::operator*
                           ((_Deque_iterator<unsigned_char,_unsigned_char_&,_unsigned_char_*> *)
                            local_1c60);
        pvVar8 = (void *)std::ostream::operator<<(poVar6,(uint)*pbVar9);
        std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
        std::_Deque_iterator<unsigned_char,_unsigned_char_&,_unsigned_char_*>::operator++
                  ((_Deque_iterator<unsigned_char,_unsigned_char_&,_unsigned_char_*> *)local_1c60);
      }
      poVar6 = std::operator<<((ostream *)&std::cerr,"bug");
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      pvVar3 = std::deque<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((deque<unsigned_char,_std::allocator<unsigned_char>_> *)local_1c20,0);
      poVar6 = std::operator<<((ostream *)&std::cerr,*pvVar3);
      pvVar3 = std::deque<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((deque<unsigned_char,_std::allocator<unsigned_char>_> *)local_1c20,1);
      poVar6 = std::operator<<(poVar6,*pvVar3);
      pvVar3 = std::deque<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((deque<unsigned_char,_std::allocator<unsigned_char>_> *)local_1c20,2);
      poVar6 = std::operator<<(poVar6,*pvVar3);
      poVar6 = std::operator<<(poVar6," was hashed to ");
      poVar6 = (ostream *)
               std::ostream::operator<<
                         (poVar6,(ulonglong)
                                 s.super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Deque_impl_data._M_finish._M_node);
      poVar6 = std::operator<<(poVar6," when true hash value is ");
      uVar7 = KarpRabinHash<unsigned_long_long,unsigned_char>::
              hash<std::deque<unsigned_char,std::allocator<unsigned_char>>>
                        ((KarpRabinHash<unsigned_long_long,unsigned_char> *)
                         &s.super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                          .super__Deque_impl_data._M_finish._M_node,
                         (deque<unsigned_char,_std::allocator<unsigned_char>_> *)local_1c20);
      pvVar8 = (void *)std::ostream::operator<<(poVar6,uVar7);
      std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
      for (local_1c84 = 0; local_1c84 < 3; local_1c84 = local_1c84 + 1) {
        pvVar3 = std::deque<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           ((deque<unsigned_char,_std::allocator<unsigned_char>_> *)local_1c20,
                            (ulong)local_1c84);
        poVar6 = std::operator<<((ostream *)&std::cerr,*pvVar3);
        poVar6 = std::operator<<(poVar6,"->");
        pbVar9 = std::deque<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           ((deque<unsigned_char,_std::allocator<unsigned_char>_> *)local_1c20,
                            (ulong)local_1c84);
        pvVar8 = (void *)std::ostream::operator<<(poVar6,hf.hasher.hashvalues[(ulong)*pbVar9 - 1]);
        std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
      }
      generator._5015_1_ = 0;
      goto LAB_001043be;
    }
    local_1c38 = local_1c38 + 1;
  } while( true );
}

Assistant:

bool isItAFunction(uint L = 7) {
  mersenneRNG generator(5);
  const uint n(3); // n-grams
  hashfunction hf(n, L);
  deque<unsigned char> s;
  for (uint32 k = 0; k < n; ++k) {
    unsigned char c = static_cast<unsigned char>(generator() + 65);
    s.push_back(c);
    hf.eat(c);
  }
  for (uint32 k = 0; k < 100000; ++k) {
    unsigned char out = s.front();
    s.pop_front();
    char c(generator() + 65);

    s.push_back(c);
    hf.update(out, c);
    if (hf.hash(s) != hf.hashvalue) {
      for (deque<unsigned char>::iterator ii = s.begin(); ii != s.end(); ++ii)
        cout << *ii << " " << static_cast<uint32>(*ii) << endl;
      cerr << "bug" << endl;
      cerr << s[0] << s[1] << s[2] << " was hashed to " << hf.hashvalue
           << " when true hash value is " << hf.hash(s) << endl;
      for (uint j = 0; j < n; ++j)
        cerr << s[j] << "->" << hf.hasher.hashvalues[s[j]] << endl;
      return false;
    }
  }
  return true;
}